

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

size_t __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
GetNonEmptyHeapBlockCount
          (HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          bool checkCount)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  Recycler *pRVar2;
  RecyclerSweepManager *pRVar3;
  code *pcVar4;
  long lVar5;
  bool bVar6;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar7;
  size_t sVar8;
  undefined4 *puVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  
  pSVar7 = this->fullBlockList;
  if (pSVar7 == (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    lVar10 = 0;
  }
  else {
    lVar11 = 1;
    do {
      lVar10 = lVar11;
      pSVar1 = (pSVar7->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
               super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar7 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
      lVar11 = lVar10 + 1;
    } while (pSVar7 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0);
  }
  pSVar7 = this->heapBlockList;
  if (pSVar7 == (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar5 = 1;
    do {
      lVar11 = lVar5;
      pSVar1 = (pSVar7->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
               super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar7 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
      lVar5 = lVar11 + 1;
    } while (pSVar7 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0);
  }
  uVar12 = lVar11 + lVar10;
  pRVar2 = ((this->super_HeapBucket).heapInfo)->recycler;
  if ((pRVar2 != (Recycler *)0x0) &&
     (pRVar3 = pRVar2->recyclerSweepManager, pRVar3 != (RecyclerSweepManager *)0x0)) {
    sVar8 = RecyclerSweep::
            GetHeapBlockCount<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                      (&pRVar3->defaultHeapRecyclerSweep,this);
    uVar12 = uVar12 + sVar8;
  }
  if ((checkCount) && (uVar12 != (this->super_HeapBucket).heapBlockCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1cc,
                       "(!checkCount || heapBlockCount == currentHeapBlockCount || (heapBlockCount >= 65535 && allocatingDuringConcurrentSweep))"
                       ,
                       "!checkCount || heapBlockCount == currentHeapBlockCount || (heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)"
                      );
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  return uVar12;
}

Assistant:

size_t
HeapBucketT<TBlockType>::GetNonEmptyHeapBlockCount(bool checkCount) const
{
    size_t currentHeapBlockCount = HeapBlockList::Count(fullBlockList);
    currentHeapBlockCount += HeapBlockList::Count(heapBlockList);
    bool allocatingDuringConcurrentSweep = false;

#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        allocatingDuringConcurrentSweep = true;
        // This lock is needed only in the debug mode while we verify block counts. Not needed otherwise, as this list is never accessed concurrently.
        // Items are added to it by the allocator when allocations are allowed during concurrent sweep. The list is drained during the next sweep while
        // allocation are stopped.
        debugSweepableHeapBlockListLock.Enter();
        if (allocableHeapBlockListHead != nullptr)
        {
            currentHeapBlockCount += QueryDepthInterlockedSList(allocableHeapBlockListHead);
        }
        currentHeapBlockCount += HeapBlockList::Count(sweepableHeapBlockList);
        debugSweepableHeapBlockListLock.Leave();
    }
#endif
#endif

    // Recycler can be null if we have OOM in the ctor
    if (this->GetRecycler() && this->GetRecycler()->recyclerSweepManager != nullptr)
    {
        currentHeapBlockCount += this->GetRecycler()->recyclerSweepManager->GetHeapBlockCount(this);
    }
#endif

    // There is no way to determine the number of item in an SLIST if there are >= 65535 items in the list.
    RECYCLER_SLOW_CHECK(Assert(!checkCount || heapBlockCount == currentHeapBlockCount || (heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)));

    return currentHeapBlockCount;
}